

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::HttpEntityBodyReader::doneReading(HttpEntityBodyReader *this)

{
  PromiseFulfiller<void> *pPVar1;
  HttpInputStreamImpl *pHVar2;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_28;
  
  pHVar2 = getInner(this);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::unsetCurrentWrapper
            (&pHVar2->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>,
             &this->weakInner);
  this->finished = true;
  pPVar1 = (pHVar2->onMessageDone).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_28);
    local_28.disposer = (Disposer *)0x0;
    local_28.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (&(pHVar2->onMessageDone).ptr,&local_28);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_28);
    pHVar2->pendingMessageCount = pHVar2->pendingMessageCount - 1;
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x5c1,FAILED,"onMessageDone != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)&local_28);
}

Assistant:

void doneReading() {
    auto& inner = getInner();
    inner.unsetCurrentWrapper(weakInner);
    finished = true;
    inner.finishRead();
  }